

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O0

void __thiscall
MathML::AST::ConstantExpression::relationalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Operator in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  Error err_3;
  double val2;
  double val1;
  Error err_2;
  Error err_1;
  Error err;
  ErrorCode in_stack_fffffffffffffe0c;
  Error *in_stack_fffffffffffffe10;
  Error *this_00;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  Error local_198;
  double local_148;
  double local_140;
  allocator<char> local_131;
  string local_130 [32];
  undefined1 local_110 [55];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [71];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [52];
  Operator local_1c;
  long *local_18;
  long *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = (**(code **)(*in_RDI + 0x48))();
  if ((iVar1 == 0) || (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 0)) {
    if (in_RDI[7] != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      Error::Error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(String *)0xc8f489);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],local_50);
      Error::~Error((Error *)0xc8f4ce);
    }
    (**(code **)(*local_10 + 0x30))(0);
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x48))();
    if ((iVar1 == 1) || (iVar1 = (**(code **)(*local_18 + 0x48))(), iVar1 == 1)) {
      iVar1 = (**(code **)(*in_RDI + 0x48))();
      iVar2 = (**(code **)(*local_18 + 0x48))();
      if (iVar1 == iVar2) {
        if (local_1c == EQ) {
          lVar3 = (**(code **)(*in_RDI + 0x58))();
          lVar4 = (**(code **)(*local_18 + 0x58))();
          (**(code **)(*local_10 + 0x40))(local_10,lVar3 == lVar4);
        }
        else if (local_1c == NEQ) {
          lVar3 = (**(code **)(*in_RDI + 0x58))();
          lVar4 = (**(code **)(*local_18 + 0x58))();
          (**(code **)(*local_10 + 0x40))(local_10,lVar3 != lVar4);
        }
        else {
          if (in_RDI[7] != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar1,in_stack_fffffffffffffe50),in_stack_fffffffffffffe48,
                       in_stack_fffffffffffffe40);
            Error::Error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(String *)0xc8f7d5);
            std::__cxx11::string::~string(local_130);
            std::allocator<char>::~allocator(&local_131);
            (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],local_110);
            Error::~Error((Error *)0xc8f81a);
          }
          (**(code **)(*local_10 + 0x30))(0);
        }
      }
      else {
        if (in_RDI[7] != 0) {
          __s = &local_d9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar1,in_stack_fffffffffffffe50),(char *)__s,in_stack_fffffffffffffe40
                    );
          Error::Error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(String *)0xc8f5fb);
          std::__cxx11::string::~string(local_d8);
          std::allocator<char>::~allocator(&local_d9);
          (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],local_b8);
          Error::~Error((Error *)0xc8f640);
        }
        (**(code **)(*local_10 + 0x30))(0);
      }
    }
    else {
      local_140 = (double)(**(code **)(*in_RDI + 0x50))();
      local_148 = (double)(**(code **)(*local_18 + 0x50))();
      switch(local_1c) {
      case EQ:
        (**(code **)(*local_10 + 0x40))(local_10,local_140 == local_148);
        break;
      case NEQ:
        (**(code **)(*local_10 + 0x40))(local_10,local_140 != local_148);
        break;
      case LTE:
        (**(code **)(*local_10 + 0x40))(local_10,local_140 <= local_148);
        break;
      case GTE:
        (**(code **)(*local_10 + 0x40))(local_10,local_148 <= local_140);
        break;
      case LT:
        (**(code **)(*local_10 + 0x40))(local_10,local_140 < local_148);
        break;
      case GT:
        (**(code **)(*local_10 + 0x40))(local_10,local_148 < local_140);
        break;
      default:
        if (in_RDI[7] != 0) {
          BinaryComparisonExpression::operatorString_abi_cxx11_(local_1c);
          this_00 = &local_198;
          std::operator+(in_stack_fffffffffffffe58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          Error::Error(this_00,in_stack_fffffffffffffe0c,(String *)0xc8fa7e);
          std::__cxx11::string::~string((string *)&local_198);
          (**(code **)(*(long *)in_RDI[7] + 0x10))((long *)in_RDI[7],&local_198.mMsg.field_2);
          Error::~Error((Error *)0xc8fab3);
        }
        (**(code **)(*local_10 + 0x30))(0);
      }
    }
  }
  return;
}

Assistant:

void ConstantExpression::relationalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::BinaryComparisonExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            else if ( this->getType() == SCALAR_BOOL || rhs.getType() == SCALAR_BOOL )
            {
                //check if both bool

                if ( this->getType() != rhs.getType() )
                {
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "not both operands of type boolean for binary comparison operation" );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }

                // valid ==
                if ( op == AST::BinaryComparisonExpression::EQ )
                {
                    result.setValue( this->getLongValue() == rhs.getLongValue() );
                    return ;
                }

                // valid !=
                else if ( op == AST::BinaryComparisonExpression::NEQ )
                {
                    result.setValue( this->getLongValue() != rhs.getLongValue() );
                    return ;
                }

                //invalid: <, <=, >, ..
                if ( mErrorHandler )
                {
                    Error err( Error::ERR_INVALIDPARAMS, "boolean operand(s) not allowed for this kind of binary comparision operation" );
                    mErrorHandler->handleError( &err );
                }
                result.setValue( 0. );
                return;
            }

            //only double or long values
            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();

                switch ( op )
                {

                case AST::BinaryComparisonExpression::EQ:
                    result.setValue( val1 == val2 );
                    return ;

                case AST::BinaryComparisonExpression::NEQ:
                    result.setValue( val1 != val2 );
                    return ;

                case AST::BinaryComparisonExpression::LT:
                    result.setValue( val1 < val2 );
                    return ;

                case AST::BinaryComparisonExpression::LTE:
                    result.setValue( val1 <= val2 );
                    return ;

                case AST::BinaryComparisonExpression::GT:
                    result.setValue( val1 > val2 );
                    return ;

                case AST::BinaryComparisonExpression::GTE:
                    result.setValue( val1 >= val2 );
                    return ;

                default:
                    if ( mErrorHandler )
                    {
                        Error err( Error::ERR_INVALIDPARAMS, "invalid operator: " + AST::BinaryComparisonExpression::operatorString( op ) );
                        mErrorHandler->handleError( &err );
                    }
                    result.setValue( 0. );
                    return;
                }
            }
        }